

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

bool Socks5(string *strDest,uint16_t port,ProxyCredentials *auth,Sock *sock)

{
  long lVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  IntrRecvError IVar5;
  Logger *pLVar6;
  char *pcVar7;
  bool bVar8;
  size_t len;
  int iVar9;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vSocks5Init;
  uint16_t port_local;
  uint8_t pchRet2 [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vSocks5;
  uint8_t pchRet1 [2];
  uint8_t pchRet3 [256];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port_local = port;
  pLVar6 = LogInstance();
  bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
  if (bVar4) {
    logging_function._M_str = "Socks5";
    logging_function._M_len = 6;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
    ;
    source_file._M_len = 0x5b;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function,source_file,0x178,NET,Debug,(ConstevalFormatString<1U>)0x877300,
               strDest);
  }
  if (0xff < strDest->_M_string_length) {
    logging_function_00._M_str = "Socks5";
    logging_function_00._M_len = 6;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
    ;
    source_file_00._M_len = 0x5b;
    LogPrintFormatInternal<>
              (logging_function_00,source_file_00,0x17a,ALL,Error,
               (ConstevalFormatString<0U>)0x877316);
    bVar8 = false;
    goto LAB_006ae577;
  }
  vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pchRet3[0] = '\x05';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&vSocks5Init,pchRet3);
  if (auth == (ProxyCredentials *)0x0) {
    pchRet3[0] = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
    pchRet3._0_8_ = (ulong)(uint7)pchRet3._1_7_ << 8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
  }
  else {
    pchRet3[0] = '\x02';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
    pchRet3[0] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
    pchRet3[0] = '\x02';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5Init,pchRet3);
  }
  (*sock->_vptr_Sock[0x10])
            (sock,vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
             (long)vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,g_socks5_recv_timeout.__r,
             &g_socks5_interrupt);
  IVar5 = InterruptibleRecv(pchRet1,2,g_socks5_recv_timeout,sock);
  if (IVar5 == OK) {
    if (pchRet1[0] != '\x05') {
      logging_function_03._M_str = "Socks5";
      logging_function_03._M_len = 6;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
      ;
      source_file_03._M_len = 0x5b;
      LogPrintFormatInternal<>
                (logging_function_03,source_file_03,399,ALL,Error,
                 (ConstevalFormatString<0U>)0x877379);
      goto LAB_006ae55f;
    }
    if (pchRet1[1] == '\x02' && auth != (ProxyCredentials *)0x0) {
      pchRet3[0] = '\0';
      pchRet3[1] = '\0';
      pchRet3[2] = '\0';
      pchRet3[3] = '\0';
      pchRet3[4] = '\0';
      pchRet3[5] = '\0';
      pchRet3[6] = '\0';
      pchRet3[7] = '\0';
      pchRet3[8] = '\0';
      pchRet3[9] = '\0';
      pchRet3[10] = '\0';
      pchRet3[0xb] = '\0';
      pchRet3[0xc] = '\0';
      pchRet3[0xd] = '\0';
      pchRet3[0xe] = '\0';
      pchRet3[0xf] = '\0';
      pchRet3[0x10] = '\0';
      pchRet3[0x11] = '\0';
      pchRet3[0x12] = '\0';
      pchRet3[0x13] = '\0';
      pchRet3[0x14] = '\0';
      pchRet3[0x15] = '\0';
      pchRet3[0x16] = '\0';
      pchRet3[0x17] = '\0';
      vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(vSocks5.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._1_7_,1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pchRet3,(uchar *)&vSocks5)
      ;
      uVar2 = (auth->username)._M_string_length;
      if ((uVar2 < 0x100) && ((auth->password)._M_string_length < 0x100)) {
        vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(vSocks5.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,(char)uVar2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pchRet3,
                   (uchar *)&vSocks5);
        pcVar3 = (auth->username)._M_dataplus._M_p;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)pchRet3,pchRet3._8_8_,
                   pcVar3,pcVar3 + (auth->username)._M_string_length);
        vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(vSocks5.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,
                               (char)(auth->password)._M_string_length);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pchRet3,
                   (uchar *)&vSocks5);
        pcVar3 = (auth->password)._M_dataplus._M_p;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)pchRet3,pchRet3._8_8_,
                   pcVar3,pcVar3 + (auth->password)._M_string_length);
        (*sock->_vptr_Sock[0x10])
                  (sock,pchRet3._0_8_,pchRet3._8_8_ - pchRet3._0_8_,g_socks5_recv_timeout.__r,
                   &g_socks5_interrupt);
        pLVar6 = LogInstance();
        bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar6,PROXY,Debug);
        if (bVar4) {
          logging_function_05._M_str = "Socks5";
          logging_function_05._M_len = 6;
          source_file_05._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
          ;
          source_file_05._M_len = 0x5b;
          LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                    (logging_function_05,source_file_05,0x19f,PROXY,Debug,
                     (ConstevalFormatString<2U>)0x8773ba,&auth->username,&auth->password);
        }
        IVar5 = InterruptibleRecv((uint8_t *)&vSocks5,2,g_socks5_recv_timeout,sock);
        if (IVar5 == OK) {
          pcVar7 = "Proxy authentication unsuccessful\n";
          iVar9 = 0x1a6;
          if (((char)vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start == '\x01') &&
             (vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start._1_1_ == '\0')) {
            if (pchRet3._0_8_ != 0) {
              operator_delete((void *)pchRet3._0_8_,pchRet3._16_8_ - pchRet3._0_8_);
            }
            goto LAB_006ae5da;
          }
        }
        else {
          pcVar7 = "Error reading proxy authentication response\n";
          iVar9 = 0x1a2;
        }
        logging_function_06._M_str = "Socks5";
        logging_function_06._M_len = 6;
        source_file_06._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
        ;
        source_file_06._M_len = 0x5b;
        LogPrintFormatInternal<>
                  (logging_function_06,source_file_06,iVar9,ALL,Error,
                   (ConstevalFormatString<0U>)pcVar7);
      }
      else {
        logging_function_02._M_str = "Socks5";
        logging_function_02._M_len = 6;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
        ;
        source_file_02._M_len = 0x5b;
        LogPrintFormatInternal<>
                  (logging_function_02,source_file_02,0x197,ALL,Error,
                   (ConstevalFormatString<0U>)0x877395);
      }
      if (pchRet3._0_8_ != 0) {
        operator_delete((void *)pchRet3._0_8_,pchRet3._16_8_ - pchRet3._0_8_);
      }
      goto LAB_006ae55f;
    }
    if (pchRet1[1] != '\0') {
      logging_function_04._M_str = "Socks5";
      logging_function_04._M_len = 6;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
      ;
      source_file_04._M_len = 0x5b;
      LogPrintFormatInternal<unsigned_char>
                (logging_function_04,source_file_04,0x1ac,ALL,Error,
                 (ConstevalFormatString<1U>)0x877435,pchRet1 + 1);
      goto LAB_006ae55f;
    }
LAB_006ae5da:
    vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pchRet3[0] = '\x05';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = '\x01';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = '\x03';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = (uint8_t)strDest->_M_string_length;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pcVar3 = (strDest->_M_dataplus)._M_p;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&vSocks5,
               vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,pcVar3,pcVar3 + strDest->_M_string_length);
    pchRet3[0] = port_local._1_1_;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    pchRet3[0] = (uint8_t)port_local;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&vSocks5,pchRet3);
    (*sock->_vptr_Sock[0x10])
              (sock,vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
               (long)vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,g_socks5_recv_timeout.__r,
               &g_socks5_interrupt);
    IVar5 = InterruptibleRecv(pchRet2,4,g_socks5_recv_timeout,sock);
    if (IVar5 == OK) {
      if (pchRet2[0] != '\x05') {
        pcVar7 = "Proxy failed to accept request\n";
        iVar9 = 0x1c6;
        goto LAB_006ae795;
      }
      if (pchRet2[1] != '\0') {
        pLVar6 = LogInstance();
        bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
        if (bVar4) {
          Socks5ErrorString_abi_cxx11_((string *)pchRet3,pchRet2[1]);
          logging_function_07._M_str = "Socks5";
          logging_function_07._M_len = 6;
          source_file_07._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
          ;
          source_file_07._M_len = 0x5b;
          LogPrintFormatInternal<std::__cxx11::string,unsigned_short,std::__cxx11::string>
                    (logging_function_07,source_file_07,0x1cc,NET,Debug,
                     (ConstevalFormatString<3U>)0x8774ab,strDest,&port_local,(string *)pchRet3);
          if ((uint8_t *)pchRet3._0_8_ != pchRet3 + 0x10) {
            operator_delete((void *)pchRet3._0_8_,pchRet3._16_8_ + 1);
          }
        }
        goto LAB_006ae7c0;
      }
      if (pchRet2[2] != '\0') {
        pcVar7 = "Error: malformed proxy response\n";
        iVar9 = 0x1d0;
        goto LAB_006ae795;
      }
      if (pchRet2[3] != '\x01') {
        if (pchRet2[3] == '\x03') {
          IVar5 = InterruptibleRecv(pchRet3,1,g_socks5_recv_timeout,sock);
          if (IVar5 == OK) {
            IVar5 = InterruptibleRecv(pchRet3,pchRet3._0_8_ & 0xff,g_socks5_recv_timeout,sock);
            goto LAB_006ae85d;
          }
          pcVar7 = "Error reading from proxy\n";
          iVar9 = 0x1da;
        }
        else {
          if (pchRet2[3] == '\x04') {
            len = 0x10;
            goto LAB_006ae84c;
          }
          pcVar7 = "Error: malformed proxy response\n";
          iVar9 = 0x1e2;
        }
LAB_006ae902:
        logging_function_10._M_str = "Socks5";
        logging_function_10._M_len = 6;
        source_file_10._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
        ;
        source_file_10._M_len = 0x5b;
        LogPrintFormatInternal<>
                  (logging_function_10,source_file_10,iVar9,ALL,Error,
                   (ConstevalFormatString<0U>)pcVar7);
        goto LAB_006ae7c0;
      }
      len = 4;
LAB_006ae84c:
      IVar5 = InterruptibleRecv(pchRet3,len,g_socks5_recv_timeout,sock);
LAB_006ae85d:
      pcVar7 = "Error reading from proxy\n";
      iVar9 = 0x1e7;
      if (IVar5 != OK) goto LAB_006ae902;
      IVar5 = InterruptibleRecv(pchRet3,2,g_socks5_recv_timeout,sock);
      iVar9 = 0x1eb;
      if (IVar5 != OK) goto LAB_006ae902;
      pLVar6 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar6,NET,Debug);
      bVar8 = true;
      if (bVar4) {
        logging_function_09._M_str = "Socks5";
        logging_function_09._M_len = 6;
        source_file_09._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
        ;
        source_file_09._M_len = 0x5b;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_09,source_file_09,0x1ee,NET,Debug,
                   (ConstevalFormatString<1U>)0x87750c,strDest);
      }
    }
    else {
      if (IVar5 != Timeout) {
        pcVar7 = "Error while reading proxy response\n";
        iVar9 = 0x1c1;
LAB_006ae795:
        logging_function_08._M_str = "Socks5";
        logging_function_08._M_len = 6;
        source_file_08._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
        ;
        source_file_08._M_len = 0x5b;
        LogPrintFormatInternal<>
                  (logging_function_08,source_file_08,iVar9,ALL,Error,
                   (ConstevalFormatString<0U>)pcVar7);
      }
LAB_006ae7c0:
      bVar8 = false;
    }
    if (vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vSocks5.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)vSocks5.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vSocks5.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    logging_function_01._M_str = "Socks5";
    logging_function_01._M_len = 6;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
    ;
    source_file_01._M_len = 0x5b;
    LogPrintFormatInternal<std::__cxx11::string,unsigned_short>
              (logging_function_01,source_file_01,0x18b,ALL,Info,(ConstevalFormatString<2U>)0x877329
               ,strDest,&port_local);
LAB_006ae55f:
    bVar8 = false;
  }
  if (vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vSocks5Init.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vSocks5Init.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vSocks5Init.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_006ae577:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool Socks5(const std::string& strDest, uint16_t port, const ProxyCredentials* auth, const Sock& sock)
{
    try {
        IntrRecvError recvr;
        LogDebug(BCLog::NET, "SOCKS5 connecting %s\n", strDest);
        if (strDest.size() > 255) {
            LogError("Hostname too long\n");
            return false;
        }
        // Construct the version identifier/method selection message
        std::vector<uint8_t> vSocks5Init;
        vSocks5Init.push_back(SOCKSVersion::SOCKS5); // We want the SOCK5 protocol
        if (auth) {
            vSocks5Init.push_back(0x02); // 2 method identifiers follow...
            vSocks5Init.push_back(SOCKS5Method::NOAUTH);
            vSocks5Init.push_back(SOCKS5Method::USER_PASS);
        } else {
            vSocks5Init.push_back(0x01); // 1 method identifier follows...
            vSocks5Init.push_back(SOCKS5Method::NOAUTH);
        }
        sock.SendComplete(vSocks5Init, g_socks5_recv_timeout, g_socks5_interrupt);
        uint8_t pchRet1[2];
        if (InterruptibleRecv(pchRet1, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
            LogPrintf("Socks5() connect to %s:%d failed: InterruptibleRecv() timeout or other failure\n", strDest, port);
            return false;
        }
        if (pchRet1[0] != SOCKSVersion::SOCKS5) {
            LogError("Proxy failed to initialize\n");
            return false;
        }
        if (pchRet1[1] == SOCKS5Method::USER_PASS && auth) {
            // Perform username/password authentication (as described in RFC1929)
            std::vector<uint8_t> vAuth;
            vAuth.push_back(0x01); // Current (and only) version of user/pass subnegotiation
            if (auth->username.size() > 255 || auth->password.size() > 255) {
                LogError("Proxy username or password too long\n");
                return false;
            }
            vAuth.push_back(auth->username.size());
            vAuth.insert(vAuth.end(), auth->username.begin(), auth->username.end());
            vAuth.push_back(auth->password.size());
            vAuth.insert(vAuth.end(), auth->password.begin(), auth->password.end());
            sock.SendComplete(vAuth, g_socks5_recv_timeout, g_socks5_interrupt);
            LogDebug(BCLog::PROXY, "SOCKS5 sending proxy authentication %s:%s\n", auth->username, auth->password);
            uint8_t pchRetA[2];
            if (InterruptibleRecv(pchRetA, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
                LogError("Error reading proxy authentication response\n");
                return false;
            }
            if (pchRetA[0] != 0x01 || pchRetA[1] != 0x00) {
                LogError("Proxy authentication unsuccessful\n");
                return false;
            }
        } else if (pchRet1[1] == SOCKS5Method::NOAUTH) {
            // Perform no authentication
        } else {
            LogError("Proxy requested wrong authentication method %02x\n", pchRet1[1]);
            return false;
        }
        std::vector<uint8_t> vSocks5;
        vSocks5.push_back(SOCKSVersion::SOCKS5);   // VER protocol version
        vSocks5.push_back(SOCKS5Command::CONNECT); // CMD CONNECT
        vSocks5.push_back(0x00);                   // RSV Reserved must be 0
        vSocks5.push_back(SOCKS5Atyp::DOMAINNAME); // ATYP DOMAINNAME
        vSocks5.push_back(strDest.size());         // Length<=255 is checked at beginning of function
        vSocks5.insert(vSocks5.end(), strDest.begin(), strDest.end());
        vSocks5.push_back((port >> 8) & 0xFF);
        vSocks5.push_back((port >> 0) & 0xFF);
        sock.SendComplete(vSocks5, g_socks5_recv_timeout, g_socks5_interrupt);
        uint8_t pchRet2[4];
        if ((recvr = InterruptibleRecv(pchRet2, 4, g_socks5_recv_timeout, sock)) != IntrRecvError::OK) {
            if (recvr == IntrRecvError::Timeout) {
                /* If a timeout happens here, this effectively means we timed out while connecting
                 * to the remote node. This is very common for Tor, so do not print an
                 * error message. */
                return false;
            } else {
                LogError("Error while reading proxy response\n");
                return false;
            }
        }
        if (pchRet2[0] != SOCKSVersion::SOCKS5) {
            LogError("Proxy failed to accept request\n");
            return false;
        }
        if (pchRet2[1] != SOCKS5Reply::SUCCEEDED) {
            // Failures to connect to a peer that are not proxy errors
            LogPrintLevel(BCLog::NET, BCLog::Level::Debug,
                          "Socks5() connect to %s:%d failed: %s\n", strDest, port, Socks5ErrorString(pchRet2[1]));
            return false;
        }
        if (pchRet2[2] != 0x00) { // Reserved field must be 0
            LogError("Error: malformed proxy response\n");
            return false;
        }
        uint8_t pchRet3[256];
        switch (pchRet2[3]) {
        case SOCKS5Atyp::IPV4: recvr = InterruptibleRecv(pchRet3, 4, g_socks5_recv_timeout, sock); break;
        case SOCKS5Atyp::IPV6: recvr = InterruptibleRecv(pchRet3, 16, g_socks5_recv_timeout, sock); break;
        case SOCKS5Atyp::DOMAINNAME: {
            recvr = InterruptibleRecv(pchRet3, 1, g_socks5_recv_timeout, sock);
            if (recvr != IntrRecvError::OK) {
                LogError("Error reading from proxy\n");
                return false;
            }
            int nRecv = pchRet3[0];
            recvr = InterruptibleRecv(pchRet3, nRecv, g_socks5_recv_timeout, sock);
            break;
        }
        default: {
            LogError("Error: malformed proxy response\n");
            return false;
        }
        }
        if (recvr != IntrRecvError::OK) {
            LogError("Error reading from proxy\n");
            return false;
        }
        if (InterruptibleRecv(pchRet3, 2, g_socks5_recv_timeout, sock) != IntrRecvError::OK) {
            LogError("Error reading from proxy\n");
            return false;
        }
        LogDebug(BCLog::NET, "SOCKS5 connected %s\n", strDest);
        return true;
    } catch (const std::runtime_error& e) {
        LogError("Error during SOCKS5 proxy handshake: %s\n", e.what());
        return false;
    }
}